

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountShader::shadePrimitives
          (VaryingOutputCountShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  VertexPacket *pVVar1;
  int iVar2;
  long lVar3;
  void *pvVar4;
  PrimitivePacket *pPVar5;
  int iVar6;
  float __x;
  float fVar7;
  float fVar8;
  FilterMode extraout_XMM0_Db;
  Vec4 texColor;
  Vec4 position1;
  Vec4 colors [4];
  undefined1 local_108 [8];
  float fStack_100;
  float fStack_fc;
  long local_f8;
  float local_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  PrimitivePacket *local_d0;
  undefined8 local_c8;
  size_t sStack_c0;
  float local_b8;
  void *local_a8;
  void *local_a0;
  anon_union_16_3_1194ccdc_for_v local_98;
  Vec4 local_88;
  void *local_78;
  size_t sStack_70;
  void *local_68;
  size_t sStack_60;
  void *local_58;
  size_t sStack_50;
  void *local_48;
  size_t sStack_40;
  
  local_d0 = packets;
  local_78 = (void *)0x3f800000;
  sStack_70 = 0x3f80000000000000;
  local_68 = (void *)0x3f80000000000000;
  sStack_60 = 0x3f80000000000000;
  local_58 = (void *)0x0;
  sStack_50 = 0x3f8000003f800000;
  local_48 = (void *)0x3f8000003f800000;
  sStack_40 = 0x3f80000000000000;
  if (0 < numPackets) {
    local_f8 = (long)invocationID;
    __x = (float)invocationID;
    local_a8 = (void *)(ulong)(uint)numPackets;
    pvVar4 = (void *)0x0;
    do {
      pVVar1 = local_d0[(long)pvVar4].vertices[0];
      iVar2 = *(int *)&(this->super_ShaderProgram).field_0x154;
      local_a0 = pvVar4;
      if (iVar2 == 2) {
        lVar3 = local_f8;
        fVar7 = __x;
        if (this->m_instanced == false) {
          fVar7 = pVVar1->outputs[0].v.fData[0];
          lVar3 = (long)(int)fVar7;
          fVar7 = (float)(int)fVar7;
        }
        sglr::rc::Texture2D::sample((Texture2D *)local_108,fVar7 * 0.25 + 0.125,0.5,0.0);
        iVar2 = 0;
        if (0.0 < fStack_100) {
          iVar2 = this->m_maxEmitCount;
        }
        iVar6 = iVar2 + 6;
        if ((float)local_108._0_4_ <= 0.0) {
          iVar6 = iVar2;
        }
        local_c8 = (&local_78)[lVar3 * 2];
        sStack_c0 = (&sStack_70)[lVar3 * 2];
        iVar2 = iVar6 + 10;
        if (fStack_fc <= 0.0) {
          iVar2 = iVar6;
        }
LAB_003a3c08:
        if (1 < iVar2) {
          pPVar5 = local_d0 + (long)pvVar4;
          local_ec = (float)(iVar2 / 2);
          iVar6 = 0;
          do {
            fVar7 = (((float)iVar6 + 0.5) / local_ec) * 3.142;
            if (this->m_instanced == false) {
              local_e8 = (pVVar1->position).m_data[0];
              fStack_e4 = (pVVar1->position).m_data[1];
              fStack_e0 = (pVVar1->position).m_data[2];
              fStack_dc = (pVVar1->position).m_data[3];
            }
            else {
              local_e8 = cosf(__x);
              fStack_e4 = (float)extraout_XMM0_Db;
              fVar8 = sinf(__x);
              fStack_e4 = (pVVar1->position).m_data[1] + fVar8 * 0.5;
              local_e8 = (pVVar1->position).m_data[0] + local_e8 * 0.5;
              fStack_dc = (pVVar1->position).m_data[3] + 0.0;
              fStack_e0 = (pVVar1->position).m_data[2] + 0.0;
            }
            local_b8 = cosf(fVar7);
            fVar8 = sinf(fVar7);
            local_108._4_4_ = fVar8 * 0.15 + fStack_e4;
            local_108._0_4_ = local_b8 * 0.15 + local_e8;
            fStack_fc = fStack_dc + 0.0;
            fStack_100 = fStack_e0 + 0.0;
            local_b8 = cosf(fVar7);
            fVar7 = sinf(fVar7);
            local_88.m_data[0] = local_b8 * 0.15 + local_e8;
            local_88.m_data[1] = -fVar7 * 0.15 + fStack_e4;
            local_88.m_data[2] = fStack_e0 + 0.0;
            local_88.m_data[3] = fStack_dc + 0.0;
            local_98._0_8_ = local_c8;
            local_98._8_8_ = sStack_c0;
            rr::GeometryEmitter::EmitVertex
                      (output,(Vec4 *)local_108,0.0,(GenericVec4 *)&local_98,pPVar5->primitiveIDIn);
            rr::GeometryEmitter::EmitVertex
                      (output,&local_88,0.0,(GenericVec4 *)&local_98,pPVar5->primitiveIDIn);
            iVar6 = iVar6 + 1;
          } while (iVar2 / 2 != iVar6);
        }
      }
      else {
        if (iVar2 == 1) {
          lVar3 = local_f8;
          if (this->m_instanced == false) {
            lVar3 = (long)(int)pVVar1->outputs[0].v.fData[0];
          }
          local_c8 = (&local_78)[lVar3 * 2];
          sStack_c0 = (&sStack_70)[lVar3 * 2];
          iVar2 = *(int *)((long)&this->m_emitCount->value + lVar3 * 4);
          goto LAB_003a3c08;
        }
        if (iVar2 == 0) {
          local_108 = (undefined1  [8])*(_func_int ***)&pVVar1->outputs[0].v;
          _fStack_100 = *(undefined8 *)((long)&pVVar1->outputs[0].v + 8);
          lVar3 = 0;
          if (this->m_instanced != false) {
            lVar3 = local_f8;
          }
          iVar2 = (int)*(float *)(local_108 + lVar3 * 4);
          local_c8 = ~CONCAT44(-(uint)(10 < iVar2),-(uint)(iVar2 < 10)) & DAT_00942920;
          sStack_c0 = 0x3f8000003f800000;
          goto LAB_003a3c08;
        }
      }
      rr::GeometryEmitter::EndPrimitive(output);
      pvVar4 = (void *)((long)local_a0 + 1);
    } while (pvVar4 != local_a8);
  }
  return;
}

Assistant:

void VaryingOutputCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { red, green, blue, yellow };

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];
		int						emitCount	= 0;
		tcu::Vec4				color		= tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);

		if (m_test == READ_ATTRIBUTE)
		{
			emitCount = (int)vertex->outputs[0].get<float>()[(m_instanced) ? (invocationID) : (0)];
			color = tcu::Vec4((emitCount < 10) ? (0.0f) : (1.0f), (emitCount > 10) ? (0.0f) : (1.0f), 1.0f, 1.0f);
		}
		else if (m_test == READ_UNIFORM)
		{
			const int primitiveNdx = (m_instanced) ? (invocationID) : ((int)vertex->outputs[0].get<float>().x());

			DE_ASSERT(primitiveNdx >= 0);
			DE_ASSERT(primitiveNdx < 4);

			emitCount = m_emitCount.value.i4[primitiveNdx];
			color = colors[primitiveNdx];
		}
		else if (m_test == READ_TEXTURE)
		{
			const int			primitiveNdx	= (m_instanced) ? (invocationID) : ((int)vertex->outputs[0].get<float>().x());
			const tcu::Vec2		texCoord		= tcu::Vec2(1.0f / 8.0f + (float)primitiveNdx / 4.0f, 0.5f);
			const tcu::Vec4		texColor		= m_sampler.sampler.tex2D->sample(texCoord.x(), texCoord.y(), 0.0f);

			DE_ASSERT(primitiveNdx >= 0);
			DE_ASSERT(primitiveNdx < 4);

			color = colors[primitiveNdx];
			emitCount = 0;

			if (texColor.x() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_0 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_0);
			if (texColor.y() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_1 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_1);
			if (texColor.z() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_2 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_2);
			if (texColor.w() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_3 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_3);
		}
		else
			DE_ASSERT(DE_FALSE);

		for (int ndx = 0; ndx < (int)emitCount / 2; ++ndx)
		{
			const float		angle			= (float(ndx) + 0.5f) / float(emitCount / 2) * 3.142f;
			const tcu::Vec4 basePosition	= (m_instanced) ?
												(vertex->position + tcu::Vec4(deFloatCos(float(invocationID)), deFloatSin(float(invocationID)), 0.0f, 0.0f) * 0.5f) :
												(vertex->position);
			const tcu::Vec4	position0		= basePosition + tcu::Vec4(deFloatCos(angle),  deFloatSin(angle), 0.0f, 0.0f) * 0.15f;
			const tcu::Vec4	position1		= basePosition + tcu::Vec4(deFloatCos(angle), -deFloatSin(angle), 0.0f, 0.0f) * 0.15f;
			rr::GenericVec4	fragColor;

			fragColor = color;

			output.EmitVertex(position0, 0.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position1, 0.0f, &fragColor, packets[packetNdx].primitiveIDIn);
		}

		output.EndPrimitive();
	}
}